

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisReadImmediate(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 id,
                  ZyanU8 size,ZyanBool is_signed,ZyanBool is_relative)

{
  ZyanStatus ZVar1;
  ZydisDecodedInstructionRawImmValue_ ZVar2;
  ZydisDecodedInstructionRawImmValue_ ZVar3;
  ZyanU8 value;
  ZyanU16 value_3;
  ZyanU32 value_1;
  ZyanU64 value_2;
  
  if (1 < id) {
    __assert_fail("(id == 0) || (id == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x319,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if (is_relative == '\0' || is_signed != '\0') {
    if ((instruction->raw).imm[id].size != '\0') {
      __assert_fail("instruction->raw.imm[id].size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x31b,
                    "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                   );
    }
    (instruction->raw).imm[id].size = size;
    (instruction->raw).imm[id].offset = instruction->length;
    (instruction->raw).imm[id].is_signed = is_signed;
    (instruction->raw).imm[id].is_relative = is_relative;
    switch((uint)size << 0x1d | size - 8 >> 3) {
    case 0:
      ZVar1 = ZydisInputNext(state,instruction,&value);
      if ((int)ZVar1 < 0) {
        return ZVar1;
      }
      ZVar2 = (ZydisDecodedInstructionRawImmValue_)(long)(char)value;
      ZVar3.u._1_7_ = 0;
      ZVar3.u._0_1_ = value;
      break;
    case 1:
      ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&value_3,'\x02');
      if ((int)ZVar1 < 0) {
        return ZVar1;
      }
      ZVar2 = (ZydisDecodedInstructionRawImmValue_)(long)(short)value_3;
      ZVar3.u._2_6_ = 0;
      ZVar3.u._0_2_ = value_3;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x358,
                    "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                   );
    case 3:
      ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&value_1,'\x04');
      if ((int)ZVar1 < 0) {
        return ZVar1;
      }
      ZVar2 = (ZydisDecodedInstructionRawImmValue_)(long)(int)value_1;
      ZVar3.u._4_4_ = 0;
      ZVar3.u._0_4_ = value_1;
      break;
    case 7:
      ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&value_2,'\b');
      if (-1 < (int)ZVar1) {
        (instruction->raw).imm[id].value.u = value_2;
        return 0x100000;
      }
      return ZVar1;
    }
    if (is_signed != '\0') {
      ZVar3 = ZVar2;
    }
    (instruction->raw).imm[id].value = ZVar3;
    return 0x100000;
  }
  __assert_fail("is_signed || !is_relative",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0x31a,
                "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
               );
}

Assistant:

static ZyanStatus ZydisReadImmediate(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8 id, ZyanU8 size, ZyanBool is_signed,
    ZyanBool is_relative)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT((id == 0) || (id == 1));
    ZYAN_ASSERT(is_signed || !is_relative);
    ZYAN_ASSERT(instruction->raw.imm[id].size == 0);

    instruction->raw.imm[id].size = size;
    instruction->raw.imm[id].offset = instruction->length;
    instruction->raw.imm[id].is_signed = is_signed;
    instruction->raw.imm[id].is_relative = is_relative;
    switch (size)
    {
    case 8:
    {
        ZyanU8 value;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &value));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI8)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 16:
    {
        ZyanU16 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 2));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI16)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 32:
    {
        ZyanU32 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 4));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI32)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 64:
    {
        ZyanU64 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 8));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI64)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    // TODO: Fix endianess on big-endian systems

    return ZYAN_STATUS_SUCCESS;
}